

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedPrimitive::GeneratePrivateMembers
          (RepeatedPrimitive *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *pPVar1;
  bool bVar2;
  FieldDescriptor *field;
  Sub *local_1d0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  undefined1 local_181;
  string local_180;
  allocator<char> local_149;
  string local_148;
  Sub *local_128;
  Sub local_120;
  iterator local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  RepeatedPrimitive *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldGeneratorBase::should_split(&this->super_FieldGeneratorBase);
  pPVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"\n      $pbi$::RawPtr<$pb$::RepeatedField<$Type$>> $name$_;\n    ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_28._M_len,local_28._M_str);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"\n      $pb$::RepeatedField<$Type$> $name$_;\n    ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_40._M_len,local_40._M_str);
  }
  bVar2 = HasCachedSize(this);
  pPVar1 = local_18;
  if (bVar2) {
    local_181 = 1;
    local_128 = &local_120;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"_cached_size_",&local_149);
    MakeVarintCachedSizeName_abi_cxx11_
              (&local_180,(cpp *)(this->super_FieldGeneratorBase).field_,field);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_120,&local_148,&local_180);
    local_181 = 0;
    local_68 = &local_120;
    local_60 = 1;
    v._M_len = 1;
    v._M_array = local_68;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_58._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_198,"\n              $pbi$::CachedSize $_cached_size_$;\n            ");
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (pPVar1,local_58._M_allocated_capacity,local_58._8_8_,local_198._M_len,
               local_198._M_str);
    local_1d0 = (Sub *)&local_68;
    do {
      local_1d0 = local_1d0 + -1;
      io::Printer::Sub::~Sub(local_1d0);
    } while (local_1d0 != &local_120);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  return;
}

Assistant:

void RepeatedPrimitive::GeneratePrivateMembers(io::Printer* p) const {
  if (should_split()) {
    p->Emit(R"cc(
      $pbi$::RawPtr<$pb$::RepeatedField<$Type$>> $name$_;
    )cc");
  } else {
    p->Emit(R"cc(
      $pb$::RepeatedField<$Type$> $name$_;
    )cc");
  }

  if (HasCachedSize()) {
    p->Emit({{"_cached_size_", MakeVarintCachedSizeName(field_)}},
            R"cc(
              $pbi$::CachedSize $_cached_size_$;
            )cc");
  }
}